

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O2

void __thiscall Jupiter::Plugin::~Plugin(Plugin *this)

{
  const_iterator __position;
  
  (this->super_Thinker)._vptr_Thinker = (_func_int **)&PTR_think_0015a650;
  (this->super_Rehashable)._vptr_Rehashable = (_func_int **)&PTR_OnRehash_0015a740;
  __position._M_current =
       g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  do {
    if (__position._M_current ==
        g_plugins.super__Vector_base<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00145dc5:
      Config::~Config(&(this->config).super_Config);
      std::__cxx11::string::~string((string *)&this->name);
      Rehashable::~Rehashable(&this->super_Rehashable);
      return;
    }
    if (*__position._M_current == this) {
      std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::erase
                (&g_plugins,__position);
      goto LAB_00145dc5;
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

Jupiter::Plugin::~Plugin() {
	for (auto itr = g_plugins.begin(); itr != g_plugins.end(); ++itr) {
		if (*itr == this) {
			g_plugins.erase(itr);
			break;
		}
	}
}